

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_nearest_xyz(REF_NODE ref_node,REF_DBL *xyz,REF_INT *closest_node,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_DBL dist;
  REF_INT node;
  REF_DBL *distance_local;
  REF_INT *closest_node_local;
  REF_DBL *xyz_local;
  REF_NODE ref_node_local;
  
  *closest_node = -1;
  *distance = 1e+100;
  for (dist._4_4_ = 0; dist._4_4_ < ref_node->max; dist._4_4_ = dist._4_4_ + 1) {
    if (((-1 < dist._4_4_) && (dist._4_4_ < ref_node->max)) && (-1 < ref_node->global[dist._4_4_]))
    {
      dVar1 = pow(*xyz - ref_node->real[dist._4_4_ * 0xf],2.0);
      dVar2 = pow(xyz[1] - ref_node->real[dist._4_4_ * 0xf + 1],2.0);
      dVar3 = pow(xyz[2] - ref_node->real[dist._4_4_ * 0xf + 2],2.0);
      dVar3 = dVar1 + dVar2 + dVar3;
      if (dVar3 < *distance) {
        *closest_node = dist._4_4_;
        *distance = dVar3;
      }
    }
  }
  dVar1 = sqrt(*distance);
  *distance = dVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_nearest_xyz(REF_NODE ref_node, REF_DBL *xyz,
                                        REF_INT *closest_node,
                                        REF_DBL *distance) {
  REF_INT node;
  REF_DBL dist;
  *closest_node = REF_EMPTY;
  *distance = 1.0e100;
  each_ref_node_valid_node(ref_node, node) {
    dist = pow(xyz[0] - ref_node_xyz(ref_node, 0, node), 2) +
           pow(xyz[1] - ref_node_xyz(ref_node, 1, node), 2) +
           pow(xyz[2] - ref_node_xyz(ref_node, 2, node), 2);
    if (dist < *distance) {
      *closest_node = node;
      *distance = dist;
    }
  }
  *distance = sqrt(*distance);
  return REF_SUCCESS;
}